

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_cvt.hpp
# Opt level: O2

void cvt_FMIns_to_OPNI(OPN2_Instrument *ins,OpnInstMeta *in)

{
  uint16_t uVar1;
  long lVar2;
  
  ins->percussion_key_number = in->drumTone;
  ins->inst_flags = in->flags;
  ins->fbalg = in->op[0].fbalg;
  ins->lfosens = in->op[0].lfosens;
  ins->note_offset = in->op[0].noteOffset;
  ins->midi_velocity_offset = in->midiVelocityOffset;
  for (lVar2 = 0; lVar2 != 0x1c; lVar2 = lVar2 + 7) {
    (&ins->operators[0].dtfm_30)[lVar2] = in->op[0].OPS[0].data[lVar2];
    (&ins->operators[0].level_40)[lVar2] = in->op[0].OPS[0].data[lVar2 + 1];
    (&ins->operators[0].rsatk_50)[lVar2] = in->op[0].OPS[0].data[lVar2 + 2];
    (&ins->operators[0].amdecay1_60)[lVar2] = in->op[0].OPS[0].data[lVar2 + 3];
    (&ins->operators[0].decay2_70)[lVar2] = in->op[0].OPS[0].data[lVar2 + 4];
    (&ins->operators[0].susrel_80)[lVar2] = in->op[0].OPS[0].data[lVar2 + 5];
    (&ins->operators[0].ssgeg_90)[lVar2] = in->op[0].OPS[0].data[lVar2 + 6];
  }
  uVar1 = in->soundKeyOffMs;
  ins->delay_on_ms = in->soundKeyOnMs;
  ins->delay_off_ms = uVar1;
  return;
}

Assistant:

static void cvt_FMIns_to_generic(WOPNI &ins, const OpnInstMeta &in)
{
    ins.percussion_key_number = in.drumTone;
    ins.inst_flags = in.flags;

    ins.fbalg = in.op[0].fbalg;
    ins.lfosens = in.op[0].lfosens;
    ins.note_offset = in.op[0].noteOffset;

    ins.midi_velocity_offset = in.midiVelocityOffset;

    for(size_t op = 0; op < 4; op++)
    {
        ins.operators[op].dtfm_30 = in.op[0].OPS[op].data[0];
        ins.operators[op].level_40 = in.op[0].OPS[op].data[1];
        ins.operators[op].rsatk_50 = in.op[0].OPS[op].data[2];
        ins.operators[op].amdecay1_60 = in.op[0].OPS[op].data[3];
        ins.operators[op].decay2_70 = in.op[0].OPS[op].data[4];
        ins.operators[op].susrel_80 = in.op[0].OPS[op].data[5];
        ins.operators[op].ssgeg_90 = in.op[0].OPS[op].data[6];
    }

    ins.delay_on_ms = in.soundKeyOnMs;
    ins.delay_off_ms = in.soundKeyOffMs;
}